

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O2

void __thiscall tinyusdz::Prim::Prim(Prim *this,Value *rhs)

{
  _Rb_tree_header *p_Var1;
  vtable_type *pvVar2;
  uint32_t uVar3;
  value_type *pvVar4;
  Value *extraout_RDX;
  Value *extraout_RDX_00;
  Value *v;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> pv;
  allocator local_149;
  string local_148;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_128;
  Path local_100;
  
  Path::Path(&this->_abs_path);
  Path::Path(&this->_path);
  Path::Path(&this->_elementPath);
  (this->_prim_type_name)._M_dataplus._M_p = (pointer)&(this->_prim_type_name).field_2;
  (this->_prim_type_name)._M_string_length = 0;
  (this->_prim_type_name).field_2._M_local_buf[0] = '\0';
  this->_specifier = Invalid;
  (this->_data).v_.vtable = (vtable_type *)linb::any::vtable_for_type<decltype(nullptr)>()::table;
  (this->_data).v_.storage.dynamic = (void *)0x0;
  (this->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header;
  (this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->_child_dirty = false;
  this->_primChildrenIndicesIsValid = false;
  (this->_primChildrenIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_primChildrenIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_primChildrenIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->_prim_id = -1;
  p_Var1 = &(this->_variantSets)._M_t._M_impl.super__Rb_tree_header;
  (this->_variantSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_variantSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_variantSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_variantSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_variantSets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pvVar2 = (rhs->v_).vtable;
  if ((pvVar2 != (vtable_type *)0x0) && (uVar3 = (*pvVar2->type_id)(), 0x3ff < uVar3)) {
    pvVar2 = (rhs->v_).vtable;
    v = extraout_RDX;
    if ((pvVar2 != (vtable_type *)0x0) &&
       (uVar3 = (*pvVar2->type_id)(), v = extraout_RDX_00, 0x2005 < uVar3)) {
      return;
    }
    GetPrimElementName_abi_cxx11_
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_100,(tinyusdz *)rhs,v);
    nonstd::optional_lite::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_128,
               (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_100);
    nonstd::optional_lite::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_100);
    if (local_128.has_value_ == true) {
      pvVar4 = nonstd::optional_lite::
               optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::value(&local_128);
      std::__cxx11::string::string((string *)&local_148,"",&local_149);
      Path::Path(&local_100,pvVar4,&local_148);
      Path::operator=(&this->_path,&local_100);
      Path::~Path(&local_100);
      std::__cxx11::string::_M_dispose();
      pvVar4 = nonstd::optional_lite::
               optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::value(&local_128);
      std::__cxx11::string::string((string *)&local_148,"",&local_149);
      Path::Path(&local_100,pvVar4,&local_148);
      Path::operator=(&this->_elementPath,&local_100);
      Path::~Path(&local_100);
      std::__cxx11::string::_M_dispose();
    }
    nonstd::optional_lite::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~optional(&local_128);
    linb::any::operator=(&(this->_data).v_,&rhs->v_);
  }
  return;
}

Assistant:

Prim::Prim(const value::Value &rhs) {
  // Check if type is Prim(Model(GPrim), usdShade, usdLux, etc.)
  if ((value::TypeId::TYPE_ID_MODEL_BEGIN <= rhs.type_id()) &&
      (value::TypeId::TYPE_ID_MODEL_END > rhs.type_id())) {
    if (auto pv = GetPrimElementName(rhs)) {
      _path = Path(pv.value(), /* prop part*/ "");
      _elementPath = Path(pv.value(), /* prop part */ "");
    }

    _data = rhs;
  } else {
    // TODO: Raise an error if rhs is not an Prim
  }
}